

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fftpack.c
# Opt level: O3

int c1fgkb_(int *ido,int *ip,int *l1,int *lid,int *na,double *cc,double *cc1,int *in1,double *ch,
           double *ch1,int *in2,double *wa)

{
  double dVar1;
  double dVar2;
  double dVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  double *pdVar10;
  uint uVar11;
  uint uVar12;
  long lVar13;
  long lVar14;
  long lVar15;
  double *pdVar16;
  double *pdVar17;
  uint uVar18;
  int iVar19;
  long lVar20;
  double *pdVar21;
  uint uVar22;
  long lVar23;
  int iVar24;
  int iVar25;
  long lVar26;
  long lVar27;
  long lVar28;
  double *pdVar29;
  long lVar30;
  int iVar31;
  long lVar32;
  double *pdVar33;
  long lVar34;
  ulong uVar35;
  long lVar36;
  long lVar37;
  long lVar38;
  ulong uVar39;
  ulong uVar40;
  ulong uVar41;
  double *local_100;
  double *local_e8;
  double *local_d8;
  double *local_d0;
  
  iVar9 = *ido;
  lVar26 = (long)iVar9;
  uVar4 = *ip;
  lVar32 = (long)(int)uVar4;
  uVar22 = ~(uVar4 * iVar9);
  iVar5 = *in1;
  lVar30 = (long)iVar5;
  iVar6 = *lid;
  lVar27 = (long)iVar6;
  uVar11 = iVar6 + 1;
  iVar7 = *in2;
  lVar23 = (long)iVar7;
  uVar35 = (ulong)uVar11;
  iVar8 = *l1;
  lVar20 = (long)iVar8;
  uVar18 = uVar4 + 1;
  lVar13 = (long)(int)~(uVar11 * iVar5);
  lVar36 = (long)(int)~(iVar7 * uVar11);
  if (0 < lVar27) {
    pdVar10 = ch1 + (lVar27 + 1) * lVar23 + lVar36 + 2;
    pdVar21 = cc1 + (lVar27 + 1) * lVar30 + lVar13 + 2;
    lVar28 = uVar35 - 1;
    do {
      pdVar10[-1] = pdVar21[-1];
      *pdVar10 = *pdVar21;
      pdVar10 = pdVar10 + lVar23;
      pdVar21 = pdVar21 + lVar30;
      lVar28 = lVar28 + -1;
    } while (lVar28 != 0);
  }
  uVar11 = uVar4 - 1;
  uVar12 = uVar4 + 2;
  iVar31 = (int)((uVar4 - ((int)uVar18 >> 0x1f)) + 1) >> 1;
  if (2 < (int)uVar4) {
    uVar41 = (ulong)uVar12;
    iVar24 = 2;
    if (2 < iVar31) {
      iVar24 = iVar31;
    }
    lVar28 = (uVar41 - 2) * lVar27 + 1;
    pdVar29 = ch1 + lVar28 * lVar23 + 2;
    lVar14 = lVar27 * lVar23;
    pdVar17 = cc1 + lVar13 + lVar28 * lVar30;
    lVar15 = lVar27 * lVar30;
    lVar28 = lVar27 * 2 + 1;
    lVar37 = lVar28 * lVar23;
    pdVar10 = ch1 + lVar37 + 2;
    lVar28 = lVar28 * lVar30;
    pdVar21 = cc1 + lVar13 + lVar28;
    uVar39 = 2;
    do {
      if (0 < iVar6) {
        lVar34 = 0x10;
        pdVar16 = pdVar29;
        pdVar33 = pdVar10;
        lVar38 = uVar35 - 1;
        do {
          pdVar33[lVar36 + -1] =
               *(double *)((long)pdVar21 + lVar34 + -8) + *(double *)((long)pdVar17 + lVar34 + -8);
          pdVar16[lVar36 + -1] =
               *(double *)((long)pdVar21 + lVar34 + -8) - *(double *)((long)pdVar17 + lVar34 + -8);
          pdVar33[lVar36] =
               *(double *)((long)pdVar21 + lVar34) + *(double *)((long)pdVar17 + lVar34);
          pdVar16[lVar36] =
               *(double *)((long)pdVar21 + lVar34) - *(double *)((long)pdVar17 + lVar34);
          pdVar16 = pdVar16 + lVar23;
          lVar34 = lVar34 + lVar30 * 8;
          pdVar33 = pdVar33 + lVar23;
          lVar38 = lVar38 + -1;
        } while (lVar38 != 0);
      }
      uVar39 = uVar39 + 1;
      pdVar29 = pdVar29 + -lVar14;
      pdVar17 = pdVar17 + -lVar15;
      pdVar10 = pdVar10 + lVar14;
      pdVar21 = pdVar21 + lVar15;
    } while (uVar39 != iVar24 + 1);
    if (2 < (int)uVar4) {
      iVar24 = 2;
      if (2 < iVar31) {
        iVar24 = iVar31;
      }
      pdVar10 = ch1 + lVar37 + lVar36 + 2;
      uVar39 = 2;
      do {
        lVar37 = uVar35 - 1;
        pdVar21 = pdVar10;
        pdVar17 = cc1 + lVar13 + (lVar27 + 1) * lVar30 + 2;
        if (0 < iVar6) {
          do {
            pdVar17[-1] = pdVar21[-1] + pdVar17[-1];
            *pdVar17 = *pdVar21 + *pdVar17;
            pdVar17 = pdVar17 + lVar30;
            pdVar21 = pdVar21 + lVar23;
            lVar37 = lVar37 + -1;
          } while (lVar37 != 0);
        }
        uVar39 = uVar39 + 1;
        pdVar10 = pdVar10 + lVar14;
      } while (uVar39 != iVar24 + 1);
      if (2 < (int)uVar4) {
        iVar24 = 3;
        if (3 < iVar31) {
          iVar24 = iVar31;
        }
        iVar25 = 2;
        if (2 < iVar31) {
          iVar25 = iVar31;
        }
        lVar37 = ((uVar41 - 2) * lVar27 + 1) * lVar30;
        pdVar10 = cc1 + lVar37 + lVar13;
        pdVar21 = cc1 + lVar28 + lVar13;
        local_d0 = cc1 + lVar37 + 2;
        local_d8 = cc1 + lVar28 + 2;
        uVar39 = 2;
        do {
          if (0 < iVar6) {
            lVar37 = (uVar11 + uVar39 + -1) * lVar26;
            lVar38 = ((long)(int)(uVar11 * 2) + uVar39 + -1) * lVar26;
            lVar34 = 0x10;
            pdVar17 = ch1 + (lVar27 + 1) * lVar23 + 2;
            lVar28 = uVar35 - 1;
            pdVar29 = ch1 + ((long)(int)(iVar6 * uVar4) + 1) * lVar23 + 2;
            pdVar16 = ch1 + ((long)(iVar6 * 2) + 1) * lVar23 + 2;
            do {
              *(double *)((long)pdVar21 + lVar34 + -8) =
                   wa[(long)(int)uVar22 + lVar37 + 1] * pdVar16[lVar36 + -1] + pdVar17[lVar36 + -1];
              *(double *)((long)pdVar10 + lVar34 + -8) =
                   wa[(long)(int)uVar22 + lVar38 + 1] * pdVar29[lVar36 + -1];
              *(double *)((long)pdVar21 + lVar34) =
                   wa[(long)(int)uVar22 + lVar37 + 1] * pdVar16[lVar36] + pdVar17[lVar36];
              *(double *)((long)pdVar10 + lVar34) =
                   wa[(long)(int)uVar22 + lVar38 + 1] * pdVar29[lVar36];
              lVar34 = lVar34 + lVar30 * 8;
              pdVar29 = pdVar29 + lVar23;
              pdVar16 = pdVar16 + lVar23;
              pdVar17 = pdVar17 + lVar23;
              lVar28 = lVar28 + -1;
            } while (lVar28 != 0);
          }
          if (4 < uVar4) {
            uVar40 = 3;
            pdVar17 = ch1 + ((uVar41 - 3) * lVar27 + 1) * lVar23 + lVar36;
            pdVar29 = ch1 + (lVar27 * 3 + 1) * lVar23 + lVar36;
            do {
              iVar19 = (((int)uVar40 + -1) * ((int)uVar39 + -1)) % (int)uVar4;
              if (0 < iVar6) {
                dVar1 = wa[(long)(int)uVar22 + (long)(int)((uVar11 + iVar19) * iVar9) + 1];
                dVar2 = wa[(long)(int)uVar22 + (long)(int)((iVar19 + uVar11 * 2) * iVar9) + 1];
                lVar37 = 0x10;
                lVar28 = uVar35 - 1;
                pdVar16 = local_d0;
                pdVar33 = local_d8;
                do {
                  pdVar33[lVar13 + -1] =
                       *(double *)((long)pdVar29 + lVar37 + -8) * dVar1 + pdVar33[lVar13 + -1];
                  pdVar16[lVar13 + -1] =
                       *(double *)((long)pdVar17 + lVar37 + -8) * dVar2 + pdVar16[lVar13 + -1];
                  pdVar33[lVar13] = *(double *)((long)pdVar29 + lVar37) * dVar1 + pdVar33[lVar13];
                  pdVar16[lVar13] = *(double *)((long)pdVar17 + lVar37) * dVar2 + pdVar16[lVar13];
                  pdVar16 = pdVar16 + lVar30;
                  lVar37 = lVar37 + lVar23 * 8;
                  pdVar33 = pdVar33 + lVar30;
                  lVar28 = lVar28 + -1;
                } while (lVar28 != 0);
              }
              uVar40 = uVar40 + 1;
              pdVar17 = pdVar17 + -lVar14;
              pdVar29 = pdVar29 + lVar14;
            } while (uVar40 != iVar24 + 1);
          }
          uVar39 = uVar39 + 1;
          pdVar10 = pdVar10 + -lVar15;
          pdVar21 = pdVar21 + lVar15;
          local_d0 = local_d0 + -lVar15;
          local_d8 = local_d8 + lVar15;
        } while (uVar39 != iVar25 + 1);
      }
    }
  }
  if ((iVar9 < 2) && (*na != 1)) {
    if (2 < (int)uVar4) {
      iVar9 = 2;
      if (2 < iVar31) {
        iVar9 = iVar31;
      }
      pdVar10 = cc1 + (((ulong)uVar12 - 2) * lVar27 + 1) * lVar30 + lVar13 + 2;
      pdVar21 = cc1 + (lVar27 * 2 + 1) * lVar30 + lVar13 + 2;
      uVar41 = 2;
      do {
        if (0 < iVar6) {
          lVar20 = 0;
          lVar13 = uVar35 - 1;
          do {
            dVar1 = *(double *)((long)pdVar10 + lVar20);
            dVar2 = *(double *)((long)pdVar21 + lVar20 + -8);
            *(double *)((long)pdVar21 + lVar20 + -8) = dVar2 - dVar1;
            dVar3 = *(double *)((long)pdVar10 + lVar20 + -8);
            *(double *)((long)pdVar10 + lVar20) = *(double *)((long)pdVar21 + lVar20) - dVar3;
            *(double *)((long)pdVar21 + lVar20) = dVar3 + *(double *)((long)pdVar21 + lVar20);
            *(double *)((long)pdVar10 + lVar20 + -8) = dVar2 + dVar1;
            lVar20 = lVar20 + lVar30 * 8;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        uVar41 = uVar41 + 1;
        pdVar10 = pdVar10 + -(lVar27 * lVar30);
        pdVar21 = pdVar21 + lVar27 * lVar30;
      } while (uVar41 != iVar9 + 1);
    }
  }
  else {
    if (0 < iVar6) {
      pdVar10 = ch1 + (lVar27 + 1) * lVar23 + lVar36 + 2;
      pdVar21 = cc1 + (lVar27 + 1) * lVar30 + lVar13 + 2;
      lVar28 = uVar35 - 1;
      do {
        pdVar10[-1] = pdVar21[-1];
        *pdVar10 = *pdVar21;
        pdVar10 = pdVar10 + lVar23;
        pdVar21 = pdVar21 + lVar30;
        lVar28 = lVar28 + -1;
      } while (lVar28 != 0);
    }
    if (2 < (int)uVar4) {
      iVar24 = 2;
      if (2 < iVar31) {
        iVar24 = iVar31;
      }
      lVar28 = ((ulong)uVar12 - 2) * lVar27 + 1;
      pdVar17 = ch1 + lVar28 * lVar23 + 2;
      pdVar29 = cc1 + lVar28 * lVar30 + lVar13;
      lVar28 = lVar27 * 2 + 1;
      pdVar10 = ch1 + lVar28 * lVar23 + 2;
      pdVar21 = cc1 + lVar28 * lVar30 + lVar13;
      uVar41 = 2;
      do {
        if (0 < iVar6) {
          lVar28 = 0x10;
          pdVar16 = pdVar17;
          lVar13 = uVar35 - 1;
          pdVar33 = pdVar10;
          do {
            pdVar33[lVar36 + -1] =
                 *(double *)((long)pdVar21 + lVar28 + -8) - *(double *)((long)pdVar29 + lVar28);
            pdVar16[lVar36 + -1] =
                 *(double *)((long)pdVar21 + lVar28 + -8) + *(double *)((long)pdVar29 + lVar28);
            pdVar16[lVar36] =
                 *(double *)((long)pdVar21 + lVar28) - *(double *)((long)pdVar29 + lVar28 + -8);
            pdVar33[lVar36] =
                 *(double *)((long)pdVar21 + lVar28) + *(double *)((long)pdVar29 + lVar28 + -8);
            pdVar16 = pdVar16 + lVar23;
            lVar28 = lVar28 + lVar30 * 8;
            pdVar33 = pdVar33 + lVar23;
            lVar13 = lVar13 + -1;
          } while (lVar13 != 0);
        }
        uVar41 = uVar41 + 1;
        pdVar17 = pdVar17 + -(lVar27 * lVar23);
        pdVar29 = pdVar29 + -(lVar27 * lVar30);
        pdVar10 = pdVar10 + lVar27 * lVar23;
        pdVar21 = pdVar21 + lVar27 * lVar30;
      } while (uVar41 != iVar24 + 1);
    }
    if (iVar9 != 1) {
      uVar12 = iVar9 + 1;
      lVar13 = (long)(int)(~(iVar8 * uVar18) * iVar5 + -1);
      lVar27 = (long)(int)(~(iVar8 * uVar12) * iVar7 + -1);
      if (0 < iVar9) {
        pdVar10 = cc + ((lVar32 + 1) * lVar20 + 1) * lVar30 + lVar13 + 2;
        pdVar21 = ch + ((lVar26 + 1) * lVar20 + 1) * lVar23 + lVar27 + 2;
        uVar35 = 1;
        do {
          pdVar17 = pdVar21;
          pdVar29 = pdVar10;
          lVar36 = (ulong)(iVar8 + 1) - 1;
          if (0 < iVar8) {
            do {
              pdVar29[-1] = pdVar17[-1];
              *pdVar29 = *pdVar17;
              pdVar29 = pdVar29 + lVar30;
              pdVar17 = pdVar17 + lVar23;
              lVar36 = lVar36 + -1;
            } while (lVar36 != 0);
          }
          uVar35 = uVar35 + 1;
          pdVar10 = pdVar10 + lVar32 * lVar20 * lVar30;
          pdVar21 = pdVar21 + lVar20 * lVar23;
        } while (uVar35 != uVar12);
      }
      if (1 < (int)uVar4) {
        pdVar21 = cc + ((lVar32 + 2) * lVar20 + 1) * lVar30 + lVar13 + 2;
        lVar36 = lVar20 * lVar30;
        pdVar10 = ch + ((lVar26 * 2 + 1) * lVar20 + 1) * lVar23 + lVar27 + 2;
        uVar35 = 2;
        do {
          lVar28 = (ulong)(iVar8 + 1) - 1;
          pdVar17 = pdVar21;
          pdVar29 = pdVar10;
          if (0 < iVar8) {
            do {
              pdVar17[-1] = pdVar29[-1];
              *pdVar17 = *pdVar29;
              pdVar17 = pdVar17 + lVar30;
              pdVar29 = pdVar29 + lVar23;
              lVar28 = lVar28 + -1;
            } while (lVar28 != 0);
          }
          uVar35 = uVar35 + 1;
          pdVar21 = pdVar21 + lVar36;
          pdVar10 = pdVar10 + lVar26 * lVar20 * lVar23;
        } while (uVar35 != uVar18);
        if (1 < (int)uVar4) {
          local_100 = cc + ((lVar32 * 2 + 2) * lVar20 + 1) * lVar30 + lVar13 + 2;
          local_e8 = ch + ((lVar26 * 2 + 2) * lVar20 + 1) * lVar23 + lVar27 + 2;
          uVar35 = 2;
          do {
            if (1 < iVar9) {
              lVar13 = (uVar11 + uVar35 + -1) * lVar26;
              lVar27 = ((long)(int)(uVar11 * 2) + uVar35 + -1) * lVar26;
              uVar41 = 2;
              pdVar10 = local_100;
              pdVar21 = local_e8;
              do {
                pdVar17 = pdVar21;
                lVar28 = (ulong)(iVar8 + 1) - 1;
                pdVar29 = pdVar10;
                if (0 < iVar8) {
                  do {
                    pdVar29[-1] = wa[(long)(int)uVar22 + lVar13 + uVar41] * pdVar17[-1] -
                                  *pdVar17 * wa[(long)(int)uVar22 + lVar27 + uVar41];
                    *pdVar29 = wa[(long)(int)uVar22 + lVar13 + uVar41] * *pdVar17 +
                               wa[(long)(int)uVar22 + lVar27 + uVar41] * pdVar17[-1];
                    lVar28 = lVar28 + -1;
                    pdVar17 = pdVar17 + lVar23;
                    pdVar29 = pdVar29 + lVar30;
                  } while (lVar28 != 0);
                }
                uVar41 = uVar41 + 1;
                pdVar10 = pdVar10 + lVar36 * lVar32;
                pdVar21 = pdVar21 + lVar23 * lVar20;
              } while (uVar41 != uVar12);
            }
            uVar35 = uVar35 + 1;
            local_100 = local_100 + lVar36;
            local_e8 = local_e8 + lVar23 * lVar20 * lVar26;
          } while (uVar35 != uVar18);
        }
      }
    }
  }
  return 0;
}

Assistant:

int c1fgkb_(int *ido, int *ip, int *l1, int *
	lid, int *na, fft_real_t *cc, fft_real_t *cc1, int *in1, fft_real_t *ch, fft_real_t *
	ch1, int *in2, fft_real_t *wa)
{
    /* System generated locals */
    int ch_dim1, ch_dim2, ch_dim3, ch_offset, cc_dim1, cc_dim2, cc_dim3,
	    cc_offset, cc1_dim1, cc1_dim2, cc1_offset, ch1_dim1, ch1_dim2,
	    ch1_offset, wa_dim1, wa_dim2, wa_offset, i__1, i__2, i__3;

    /* Local variables */
     int i__, j, k, l, jc, lc, ki;
     fft_real_t wai, war;
     int ipp2, idlj, ipph;
     fft_real_t chold1, chold2;


/* FFTPACK 5.1 auxiliary routine */

    /* Parameter adjustments */
    wa_dim1 = *ido;
    wa_dim2 = *ip - 1;
    wa_offset = 1 + wa_dim1 * (1 + wa_dim2);
    wa -= wa_offset;
    cc1_dim1 = *in1;
    cc1_dim2 = *lid;
    cc1_offset = 1 + cc1_dim1 * (1 + cc1_dim2);
    cc1 -= cc1_offset;
    cc_dim1 = *in1;
    cc_dim2 = *l1;
    cc_dim3 = *ip;
    cc_offset = 1 + cc_dim1 * (1 + cc_dim2 * (1 + cc_dim3));
    cc -= cc_offset;
    ch1_dim1 = *in2;
    ch1_dim2 = *lid;
    ch1_offset = 1 + ch1_dim1 * (1 + ch1_dim2);
    ch1 -= ch1_offset;
    ch_dim1 = *in2;
    ch_dim2 = *l1;
    ch_dim3 = *ido;
    ch_offset = 1 + ch_dim1 * (1 + ch_dim2 * (1 + ch_dim3));
    ch -= ch_offset;

    /* Function Body */
    ipp2 = *ip + 2;
    ipph = (*ip + 1) / 2;
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L110: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
/* L112: */
	}
/* L111: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 1] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + cc1_dim2) * cc1_dim1 + 2] += ch1[(ki + j * ch1_dim2) *
		    ch1_dim1 + 2];
/* L117: */
	}
/* L118: */
    }
    i__1 = ipph;
    for (l = 2; l <= i__1; ++l) {
	lc = ipp2 - l;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 1] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 1];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] = wa[(l - 1 + (wa_dim2 <<
		     1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 1];
	    cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] = ch1[(ki + ch1_dim2) *
		    ch1_dim1 + 2] + wa[(l - 1 + wa_dim2) * wa_dim1 + 1] * ch1[
		    (ki + (ch1_dim2 << 1)) * ch1_dim1 + 2];
	    cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] = wa[(l - 1 + (wa_dim2 <<
		     1)) * wa_dim1 + 1] * ch1[(ki + *ip * ch1_dim2) *
		    ch1_dim1 + 2];
/* L113: */
	}
	i__2 = ipph;
	for (j = 3; j <= i__2; ++j) {
	    jc = ipp2 - j;
	    idlj = (l - 1) * (j - 1) % *ip;
	    war = wa[(idlj + wa_dim2) * wa_dim1 + 1];
	    wai = wa[(idlj + (wa_dim2 << 1)) * wa_dim1 + 1];
	    i__3 = *lid;
	    for (ki = 1; ki <= i__3; ++ki) {
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 1] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 1] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 1];
		cc1[(ki + l * cc1_dim2) * cc1_dim1 + 2] += war * ch1[(ki + j *
			 ch1_dim2) * ch1_dim1 + 2];
		cc1[(ki + lc * cc1_dim2) * cc1_dim1 + 2] += wai * ch1[(ki +
			jc * ch1_dim2) * ch1_dim1 + 2];
/* L114: */
	    }
/* L115: */
	}
/* L116: */
    }
    if (*ido > 1 || *na == 1) {
	goto L136;
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    chold1 = cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] - cc1[(ki + jc *
		    cc1_dim2) * cc1_dim1 + 2];
	    chold2 = cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] + cc1[(ki + jc *
		    cc1_dim2) * cc1_dim1 + 2];
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 1] = chold1;
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    cc1[(ki + j * cc1_dim2) * cc1_dim1 + 2] += cc1[(ki + jc *
		    cc1_dim2) * cc1_dim1 + 1];
	    cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1] = chold2;
/* L119: */
	}
/* L120: */
    }
    return 0;
L136:
    i__1 = *lid;
    for (ki = 1; ki <= i__1; ++ki) {
	ch1[(ki + ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 1];
	ch1[(ki + ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + cc1_dim2) * cc1_dim1
		+ 2];
/* L137: */
    }
    i__1 = ipph;
    for (j = 2; j <= i__1; ++j) {
	jc = ipp2 - j;
	i__2 = *lid;
	for (ki = 1; ki <= i__2; ++ki) {
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 1] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 2]
		    ;
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 1] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 1] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    2];
	    ch1[(ki + jc * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		     * cc1_dim1 + 2] - cc1[(ki + jc * cc1_dim2) * cc1_dim1 +
		    1];
	    ch1[(ki + j * ch1_dim2) * ch1_dim1 + 2] = cc1[(ki + j * cc1_dim2)
		    * cc1_dim1 + 2] + cc1[(ki + jc * cc1_dim2) * cc1_dim1 + 1]
		    ;
/* L134: */
	}
/* L135: */
    }
    if (*ido == 1) {
	return 0;
    }
    i__1 = *ido;
    for (i__ = 1; i__ <= i__1; ++i__) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 1] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (i__ * cc_dim3 + 1) * cc_dim2) * cc_dim1 + 2] = ch[(k + (
		    i__ + ch_dim3) * ch_dim2) * ch_dim1 + 2];
/* L130: */
	}
/* L131: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *l1;
	for (k = 1; k <= i__2; ++k) {
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 1] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 1];
	    cc[(k + (j + cc_dim3) * cc_dim2) * cc_dim1 + 2] = ch[(k + (j *
		    ch_dim3 + 1) * ch_dim2) * ch_dim1 + 2];
/* L122: */
	}
/* L123: */
    }
    i__1 = *ip;
    for (j = 2; j <= i__1; ++j) {
	i__2 = *ido;
	for (i__ = 2; i__ <= i__2; ++i__) {
	    i__3 = *l1;
	    for (k = 1; k <= i__3; ++k) {
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 1] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 1] - wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 2];
		cc[(k + (j + i__ * cc_dim3) * cc_dim2) * cc_dim1 + 2] = wa[
			i__ + (j - 1 + wa_dim2) * wa_dim1] * ch[(k + (i__ + j
			* ch_dim3) * ch_dim2) * ch_dim1 + 2] + wa[i__ + (j -
			1 + (wa_dim2 << 1)) * wa_dim1] * ch[(k + (i__ + j *
			ch_dim3) * ch_dim2) * ch_dim1 + 1];
/* L124: */
	    }
/* L125: */
	}
/* L126: */
    }
    return 0;
}